

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  string *tested_snippet;
  long *plVar1;
  long lVar2;
  string array_declaration;
  string case_specific_string [4];
  string local_d8;
  string local_b8;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"    int x[4][3][2][1];\n\n","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"    if (x.length() != 4) {\n        result = 0.0f;\n    }\n","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"    if (x[0].length() != 3) {\n        result = 0.0f;\n    }\n","")
  ;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"    if (x[0][0].length() != 2) {\n        result = 0.0f;\n    }\n",
             "");
  plVar1 = local_48;
  local_58[0] = plVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "    if (x[0][0][0].length() != 1) {\n        result = 0.0f;\n    }\n","");
  lVar2 = 0;
  do {
    tested_snippet = (string *)((long)&local_b8._M_dataplus._M_p + lVar2);
    if (tested_shader_type == COMPUTE_SHADER_TYPE) {
      execute_dispatch_test(this,COMPUTE_SHADER_TYPE,&local_d8,tested_snippet);
    }
    else {
      execute_draw_test(this,tested_shader_type,&local_d8,tested_snippet);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode
      ._vptr_TestNode[5])(this);
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x80);
  lVar2 = -0x80;
  do {
    if (plVar1 != (long *)plVar1[-2]) {
      operator_delete((long *)plVar1[-2],*plVar1 + 1);
    }
    plVar1 = plVar1 + -4;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ExpressionsLength1<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string array_declaration	  = "    int x[4][3][2][1];\n\n";
	std::string case_specific_string[] = { "    if (x.length() != 4) {\n"
										   "        result = 0.0f;\n    }\n",
										   "    if (x[0].length() != 3) {\n"
										   "        result = 0.0f;\n    }\n",
										   "    if (x[0][0].length() != 2) {\n"
										   "        result = 0.0f;\n    }\n",
										   "    if (x[0][0][0].length() != 1) {\n"
										   "        result = 0.0f;\n    }\n" };
	const bool test_compute = (TestCaseBase<API>::COMPUTE_SHADER_TYPE == tested_shader_type);

	for (size_t case_specific_string_index = 0;
		 case_specific_string_index < sizeof(case_specific_string) / sizeof(case_specific_string[0]);
		 case_specific_string_index++)
	{
		const std::string& test_snippet = case_specific_string[case_specific_string_index];

		if (false == test_compute)
		{
			execute_draw_test(tested_shader_type, array_declaration, test_snippet);
		}
		else
		{
			execute_dispatch_test(tested_shader_type, array_declaration, test_snippet);
		}

		/* Deallocate any resources used. */
		this->delete_objects();
	} /* for (int case_specific_string_index = 0; ...) */
}